

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter_block.cc
# Opt level: O0

void __thiscall
leveldb::FilterBlockBuilder::StartBlock(FilterBlockBuilder *this,uint64_t block_offset)

{
  long lVar1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_00;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar3;
  ulong in_RSI;
  long in_FS_OFFSET;
  uint64_t filter_index;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_ffffffffffffffc8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RSI >> 0xb);
  pvVar2 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
           std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(in_stack_ffffffffffffffc8)
  ;
  if (this_00 < pvVar2) {
    __assert_fail("filter_index >= filter_offsets_.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/leveldb/table/filter_block.cc"
                  ,0x17,"void leveldb::FilterBlockBuilder::StartBlock(uint64_t)");
  }
  while (pvVar2 = this_00,
        pvVar3 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(this_00),
        pvVar3 < pvVar2) {
    GenerateFilter((FilterBlockBuilder *)block_offset);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void FilterBlockBuilder::StartBlock(uint64_t block_offset) {
  uint64_t filter_index = (block_offset / kFilterBase);
  assert(filter_index >= filter_offsets_.size());
  while (filter_index > filter_offsets_.size()) {
    GenerateFilter();
  }
}